

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloat2Expanded
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1)

{
  bool bVar1;
  GLint value;
  GLint value_00;
  qpTestResult qVar2;
  GLint64 GVar3;
  int (*paiVar4) [2];
  TestLog *this_00;
  MessageBuilder *pMVar5;
  Hex<8UL> local_210;
  Hex<8UL> local_208;
  Hex<8UL> local_200;
  Hex<8UL> local_1f8;
  Hex<8UL> local_1f0;
  Hex<8UL> local_1e8 [3];
  MessageBuilder local_1d0;
  undefined1 local_4c [8];
  StateQueryMemoryWriteGuard<int[2]> floatVector2;
  GLint referenceAsGLintMax [2];
  GLint referenceAsGLintMin [2];
  GLfloat reference1_local;
  GLfloat reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetIntegerVerifier *this_local;
  
  GVar3 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference0);
  value = FloatStateQueryVerifiers::anon_unknown_0::clampToGLint(GVar3 + -0x3ff);
  GVar3 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference1);
  value_00 = FloatStateQueryVerifiers::anon_unknown_0::clampToGLint(GVar3 + -0x3ff);
  GVar3 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference0);
  floatVector2.m_postguard[0] =
       FloatStateQueryVerifiers::anon_unknown_0::clampToGLint(GVar3 + 0x3ff);
  GVar3 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference1);
  floatVector2.m_postguard[1] =
       FloatStateQueryVerifiers::anon_unknown_0::clampToGLint(GVar3 + 0x3ff);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[2]> *)local_4c);
  paiVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_4c);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*paiVar4);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int[2]> *)local_4c,testCtx);
  if ((bVar1) &&
     ((((paiVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_4c),
        (*paiVar4)[0] < value ||
        (paiVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_4c),
        floatVector2.m_postguard[0] < (*paiVar4)[0])) ||
       (paiVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_4c),
       (*paiVar4)[1] < value_00)) ||
      (paiVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_4c),
      floatVector2.m_postguard[1] < (*paiVar4)[1])))) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1d0,(char (*) [30])"// ERROR: expected in ranges ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c3fdfc);
    local_1e8[0] = tcu::toHex<int>(value);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1e8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c7b4d6);
    local_1f0 = tcu::toHex<int>(floatVector2.m_postguard[0]);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1f0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2b7b6d0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c3fdfc);
    local_1f8 = tcu::toHex<int>(value_00);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1f8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c7b4d6);
    local_200 = tcu::toHex<int>(floatVector2.m_postguard[1]);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_200);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29ea7ce);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2b8b5f6);
    paiVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_4c);
    local_208 = tcu::toHex<int>((*paiVar4)[0]);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_208);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
    paiVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_4c);
    local_210 = tcu::toHex<int>((*paiVar4)[1]);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_210);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c7b4d6);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyFloat2Expanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1)
{
	DE_ASSERT(de::inRange(reference0, -1.0f, 1.0f));
	DE_ASSERT(de::inRange(reference1, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	const GLint referenceAsGLintMin[] =
	{
		clampToGLint(expandGLFloatToInteger(reference0) - FLOAT_EXPANSION_E),
		clampToGLint(expandGLFloatToInteger(reference1) - FLOAT_EXPANSION_E)
	};
	const GLint referenceAsGLintMax[] =
	{
		clampToGLint(expandGLFloatToInteger(reference0) + FLOAT_EXPANSION_E),
		clampToGLint(expandGLFloatToInteger(reference1) + FLOAT_EXPANSION_E)
	};

	StateQueryMemoryWriteGuard<GLint[2]> floatVector2;
	glGetIntegerv(name, floatVector2);

	if (!floatVector2.verifyValidity(testCtx))
		return;

	if (floatVector2[0] < referenceAsGLintMin[0] || floatVector2[0] > referenceAsGLintMax[0] ||
		floatVector2[1] < referenceAsGLintMin[1] || floatVector2[1] > referenceAsGLintMax[1])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in ranges "
			<< "[" << toHex(referenceAsGLintMin[0]) << " " << toHex(referenceAsGLintMax[0]) << "], "
			<< "[" << toHex(referenceAsGLintMin[1]) << " " << toHex(referenceAsGLintMax[1]) << "]"
			<< "; got "
			<< toHex(floatVector2[0]) << ", "
			<< toHex(floatVector2[1]) << " "<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}